

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

_Bool extent_purge_lazy_impl
                (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extent_t *extent,
                size_t offset,size_t length,_Bool growing_retained)

{
  undefined1 uVar1;
  code *pcVar2;
  extent_hooks_t *peVar3;
  
  extent_hooks_assure_initialized(arena,r_extent_hooks);
  pcVar2 = (code *)(*r_extent_hooks)->purge_lazy;
  if (pcVar2 == (code *)0x0) {
    uVar1 = 1;
  }
  else {
    peVar3 = &extent_hooks_default;
    if (*r_extent_hooks != &extent_hooks_default) {
      extent_hook_pre_reentrancy(tsdn,arena);
      peVar3 = *r_extent_hooks;
      pcVar2 = (code *)peVar3->purge_lazy;
    }
    uVar1 = (*pcVar2)(peVar3,(ulong)extent->e_addr & 0xfffffffffffff000,
                      (extent->field_2).e_size_esn & 0xfffffffffffff000,offset,length,
                      arena->base->ind);
    if (*r_extent_hooks != &extent_hooks_default) {
      extent_hook_post_reentrancy(tsdn);
    }
  }
  return (_Bool)uVar1;
}

Assistant:

static bool
extent_purge_lazy_impl(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, extent_t *extent, size_t offset,
    size_t length, bool growing_retained) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);

	extent_hooks_assure_initialized(arena, r_extent_hooks);

	if ((*r_extent_hooks)->purge_lazy == NULL) {
		return true;
	}
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_pre_reentrancy(tsdn, arena);
	}
	bool err = (*r_extent_hooks)->purge_lazy(*r_extent_hooks,
	    extent_base_get(extent), extent_size_get(extent), offset, length,
	    arena_ind_get(arena));
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_post_reentrancy(tsdn);
	}

	return err;
}